

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFGroupNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  long lVar1;
  _Alloc_hider _Var2;
  XMLLoader *pXVar3;
  int iVar4;
  GroupNode *this_01;
  mapped_type *pmVar5;
  runtime_error *this_02;
  long *plVar6;
  size_type *psVar7;
  long *in_RDX;
  long lVar8;
  size_t N;
  size_t sVar9;
  size_t id;
  string local_78;
  XMLLoader *local_58;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"numChildren","");
  XML::parm(&local_78,this_00,&local_50);
  _Var2._M_p = local_78._M_dataplus._M_p;
  iVar4 = atoi(local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != &local_78.field_2) {
    operator_delete(_Var2._M_p);
  }
  N = (size_t)iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_58 = this;
  if ((*(long *)(*in_RDX + 0xa0) - *(long *)(*in_RDX + 0x98) >> 3) * -0x71c71c71c71c71c7 - N == 0) {
    this_01 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,N);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    if (iVar4 != 0) {
      lVar8 = 0;
      sVar9 = 0;
      do {
        iVar4 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + lVar8));
        local_78._M_dataplus._M_p = (pointer)(long)iVar4;
        pmVar5 = std::
                 map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       *)(xml + 0xc),(key_type *)&local_78);
        lVar1 = (long)(this_01->children).
                      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (pmVar5->ptr != (Node *)0x0) {
          (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[2])();
        }
        plVar6 = *(long **)(lVar1 + sVar9 * 8);
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x18))();
        }
        *(Node **)(lVar1 + sVar9 * 8) = pmVar5->ptr;
        sVar9 = sVar9 + 1;
        lVar8 = lVar8 + 0x48;
      } while (N != sVar9);
    }
    pXVar3 = local_58;
    (local_58->path).filename._M_dataplus._M_p = (pointer)this_01;
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_01);
    return (Ref<embree::SceneGraph::Node>)(Node *)pXVar3;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_78._M_dataplus._M_p == psVar7) {
    local_78.field_2._M_allocated_capacity = *psVar7;
    local_78.field_2._8_8_ = plVar6[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar7;
  }
  local_78._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this_02,(string *)&local_78);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFGroupNode(const Ref<XML>& xml) 
  {
    const size_t N  = atoi(xml->parm("numChildren").c_str());
    if (xml->body.size() != N) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode(N);
    for (size_t i=0; i<N; i++) 
    {
      const size_t id = xml->body[i].Int();
      group->set(i,id2node.at(id));
    }
    return group.cast<SceneGraph::Node>();
  }